

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IntVect.H
# Opt level: O3

Box * OutFlowBC::SemiCoarsen(Box *__return_storage_ptr__,Box *baseBox,int ref_factor,int direction)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int dir;
  long lVar7;
  IntVect ref_ratio;
  int local_c [3];
  
  ref_ratio.vect[0] = ref_factor;
  ref_ratio.vect[1] = ref_factor;
  ref_ratio.vect[2] = ref_factor;
  ref_ratio.vect[direction] = 1;
  uVar1 = *(undefined8 *)(baseBox->smallend).vect;
  uVar2 = *(undefined8 *)((baseBox->smallend).vect + 2);
  uVar3 = *(undefined8 *)((baseBox->bigend).vect + 2);
  *(undefined8 *)(__return_storage_ptr__->bigend).vect = *(undefined8 *)(baseBox->bigend).vect;
  *(undefined8 *)((__return_storage_ptr__->bigend).vect + 2) = uVar3;
  *(undefined8 *)(__return_storage_ptr__->smallend).vect = uVar1;
  *(undefined8 *)((__return_storage_ptr__->smallend).vect + 2) = uVar2;
  if (ref_ratio.vect[1] == 1 && ref_ratio.vect[0] == 1) {
    if (ref_ratio.vect[2] == 1) {
      return __return_storage_ptr__;
    }
    uVar4 = (__return_storage_ptr__->smallend).vect[1];
  }
  else {
    uVar4 = (__return_storage_ptr__->smallend).vect[0];
    if (ref_ratio.vect[0] != 1) {
      if (ref_ratio.vect[0] == 4) {
        if ((int)uVar4 < 0) {
          uVar4 = (int)uVar4 >> 2;
        }
        else {
          uVar4 = uVar4 >> 2;
        }
      }
      else if (ref_ratio.vect[0] == 2) {
        if ((int)uVar4 < 0) {
          uVar4 = (int)uVar4 >> 1;
        }
        else {
          uVar4 = uVar4 >> 1;
        }
      }
      else if ((int)uVar4 < 0) {
        uVar4 = ~((int)~uVar4 / ref_ratio.vect[0]);
      }
      else {
        uVar4 = (int)uVar4 / ref_ratio.vect[0];
      }
    }
    (__return_storage_ptr__->smallend).vect[0] = uVar4;
    uVar4 = (__return_storage_ptr__->smallend).vect[1];
    if (ref_ratio.vect[1] != 1) {
      if (ref_ratio.vect[1] == 4) {
        if ((int)uVar4 < 0) {
          uVar4 = (int)uVar4 >> 2;
        }
        else {
          uVar4 = uVar4 >> 2;
        }
      }
      else if (ref_ratio.vect[1] == 2) {
        if ((int)uVar4 < 0) {
          uVar4 = (int)uVar4 >> 1;
        }
        else {
          uVar4 = uVar4 >> 1;
        }
      }
      else if ((int)uVar4 < 0) {
        uVar4 = ~((int)~uVar4 / ref_ratio.vect[1]);
      }
      else {
        uVar4 = (int)uVar4 / ref_ratio.vect[1];
      }
    }
  }
  (__return_storage_ptr__->smallend).vect[1] = uVar4;
  uVar4 = (__return_storage_ptr__->smallend).vect[2];
  if (ref_ratio.vect[2] != 1) {
    if (ref_ratio.vect[2] == 4) {
      if ((int)uVar4 < 0) {
        uVar4 = (int)uVar4 >> 2;
      }
      else {
        uVar4 = uVar4 >> 2;
      }
    }
    else if (ref_ratio.vect[2] == 2) {
      if ((int)uVar4 < 0) {
        uVar4 = (int)uVar4 >> 1;
      }
      else {
        uVar4 = uVar4 >> 1;
      }
    }
    else if ((int)uVar4 < 0) {
      uVar4 = ~((int)~uVar4 / ref_ratio.vect[2]);
    }
    else {
      uVar4 = (int)uVar4 / ref_ratio.vect[2];
    }
  }
  (__return_storage_ptr__->smallend).vect[2] = uVar4;
  uVar4 = (__return_storage_ptr__->btype).itype;
  if (uVar4 == 0) {
    uVar4 = (__return_storage_ptr__->bigend).vect[0];
    if (ref_ratio.vect[0] != 1) {
      if (ref_ratio.vect[0] == 4) {
        if ((int)uVar4 < 0) {
          uVar4 = (int)uVar4 >> 2;
        }
        else {
          uVar4 = uVar4 >> 2;
        }
      }
      else if (ref_ratio.vect[0] == 2) {
        if ((int)uVar4 < 0) {
          uVar4 = (int)uVar4 >> 1;
        }
        else {
          uVar4 = uVar4 >> 1;
        }
      }
      else if ((int)uVar4 < 0) {
        uVar4 = ~((int)~uVar4 / ref_ratio.vect[0]);
      }
      else {
        uVar4 = (int)uVar4 / ref_ratio.vect[0];
      }
    }
    (__return_storage_ptr__->bigend).vect[0] = uVar4;
    uVar4 = (__return_storage_ptr__->bigend).vect[1];
    if (ref_ratio.vect[1] != 1) {
      if (ref_ratio.vect[1] == 4) {
        if ((int)uVar4 < 0) {
          uVar4 = (int)uVar4 >> 2;
        }
        else {
          uVar4 = uVar4 >> 2;
        }
      }
      else if (ref_ratio.vect[1] == 2) {
        if ((int)uVar4 < 0) {
          uVar4 = (int)uVar4 >> 1;
        }
        else {
          uVar4 = uVar4 >> 1;
        }
      }
      else if ((int)uVar4 < 0) {
        uVar4 = ~((int)~uVar4 / ref_ratio.vect[1]);
      }
      else {
        uVar4 = (int)uVar4 / ref_ratio.vect[1];
      }
    }
    (__return_storage_ptr__->bigend).vect[1] = uVar4;
    uVar4 = (__return_storage_ptr__->bigend).vect[2];
    if (ref_ratio.vect[2] != 1) {
      if (ref_ratio.vect[2] == 4) {
        if ((int)uVar4 < 0) {
          uVar4 = (int)uVar4 >> 2;
        }
        else {
          uVar4 = uVar4 >> 2;
        }
      }
      else if (ref_ratio.vect[2] == 2) {
        if ((int)uVar4 < 0) {
          uVar4 = (int)uVar4 >> 1;
        }
        else {
          uVar4 = uVar4 >> 1;
        }
      }
      else if ((int)uVar4 < 0) {
        uVar4 = ~((int)~uVar4 / ref_ratio.vect[2]);
      }
      else {
        uVar4 = (int)uVar4 / ref_ratio.vect[2];
      }
    }
  }
  else {
    local_c[0] = 0;
    local_c[1] = 0;
    local_c[2] = 0;
    lVar7 = 0;
    do {
      if (((uVar4 >> ((uint)lVar7 & 0x1f) & 1) != 0) &&
         ((__return_storage_ptr__->bigend).vect[lVar7] % ref_ratio.vect[lVar7] != 0)) {
        local_c[lVar7] = 1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    uVar5 = (__return_storage_ptr__->bigend).vect[0];
    if (ref_ratio.vect[0] != 1) {
      if (ref_ratio.vect[0] == 4) {
        if ((int)uVar5 < 0) {
          uVar5 = (int)uVar5 >> 2;
        }
        else {
          uVar5 = uVar5 >> 2;
        }
      }
      else if (ref_ratio.vect[0] == 2) {
        if ((int)uVar5 < 0) {
          uVar5 = (int)uVar5 >> 1;
        }
        else {
          uVar5 = uVar5 >> 1;
        }
      }
      else if ((int)uVar5 < 0) {
        uVar5 = ~((int)~uVar5 / ref_ratio.vect[0]);
      }
      else {
        uVar5 = (int)uVar5 / ref_ratio.vect[0];
      }
    }
    uVar6 = (__return_storage_ptr__->bigend).vect[1];
    if (ref_ratio.vect[1] != 1) {
      if (ref_ratio.vect[1] == 4) {
        if ((int)uVar6 < 0) {
          uVar6 = (int)uVar6 >> 2;
        }
        else {
          uVar6 = uVar6 >> 2;
        }
      }
      else if (ref_ratio.vect[1] == 2) {
        if ((int)uVar6 < 0) {
          uVar6 = (int)uVar6 >> 1;
        }
        else {
          uVar6 = uVar6 >> 1;
        }
      }
      else if ((int)uVar6 < 0) {
        uVar6 = ~((int)~uVar6 / ref_ratio.vect[1]);
      }
      else {
        uVar6 = (int)uVar6 / ref_ratio.vect[1];
      }
    }
    uVar4 = (__return_storage_ptr__->bigend).vect[2];
    if (ref_ratio.vect[2] != 1) {
      if (ref_ratio.vect[2] == 4) {
        if ((int)uVar4 < 0) {
          uVar4 = (int)uVar4 >> 2;
        }
        else {
          uVar4 = uVar4 >> 2;
        }
      }
      else if (ref_ratio.vect[2] == 2) {
        if ((int)uVar4 < 0) {
          uVar4 = (int)uVar4 >> 1;
        }
        else {
          uVar4 = uVar4 >> 1;
        }
      }
      else if ((int)uVar4 < 0) {
        uVar4 = ~((int)~uVar4 / ref_ratio.vect[2]);
      }
      else {
        uVar4 = (int)uVar4 / ref_ratio.vect[2];
      }
    }
    (__return_storage_ptr__->bigend).vect[0] = uVar5 + local_c[0];
    (__return_storage_ptr__->bigend).vect[1] = uVar6 + local_c[1];
    uVar4 = uVar4 + local_c[2];
  }
  (__return_storage_ptr__->bigend).vect[2] = uVar4;
  return __return_storage_ptr__;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    constexpr IntVect (AMREX_D_DECL(int i, int j, int k)) noexcept : vect{AMREX_D_DECL(i,j,k)} {}